

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

bool anon_unknown.dwarf_11255e::IsLookupOnlyVariable(ExpressionContext *ctx,VariableData *variable)

{
  ScopeData *pSVar1;
  ScopeData *curr;
  FunctionData *pFVar2;
  VariableHandle *pVVar3;
  FunctionData *pFVar4;
  
  for (pSVar1 = ctx->scope; (pSVar1 != (ScopeData *)0x0 && (pSVar1->ownerType == (TypeBase *)0x0));
      pSVar1 = pSVar1->scope) {
    pFVar4 = pSVar1->ownerFunction;
    if (pFVar4 != (FunctionData *)0x0) goto LAB_001ff110;
  }
  pFVar4 = (FunctionData *)0x0;
LAB_001ff110:
  pFVar2 = ExpressionContext::GetFunctionOwner(ctx,variable->scope);
  if (pFVar2 != (FunctionData *)0x0 && pFVar4 != (FunctionData *)0x0) {
    if (pFVar2 != pFVar4) {
      return true;
    }
    if (pFVar4->coroutine == true) {
      for (pVVar3 = (pFVar4->argumentVariables).head; pVVar3 != (VariableHandle *)0x0;
          pVVar3 = pVVar3->next) {
        if (pVVar3->variable == variable) {
          if (pVVar3 != (VariableHandle *)0x0) {
            return false;
          }
          break;
        }
      }
      if (pFVar4->contextArgument != variable) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool IsLookupOnlyVariable(ExpressionContext &ctx, VariableData *variable)
	{
		FunctionData *currentFunction = ctx.GetCurrentFunction(ctx.scope);
		FunctionData *variableFunctionOwner = ctx.GetFunctionOwner(variable->scope);

		if(currentFunction && variableFunctionOwner)
		{
			if(variableFunctionOwner != currentFunction)
				return true;

			if(currentFunction->coroutine && !IsArgumentVariable(currentFunction, variable))
				return true;
		}

		return false;
	}